

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::OnPropertyChange(Element *this,PropertyIdSet *changed_properties)

{
  uint uVar1;
  ulong uVar2;
  ElementMeta *pEVar3;
  pointer ppEVar4;
  CommonValues CVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  PropertyIdSet *__y;
  bool bVar9;
  bool bVar10;
  float fVar11;
  bitset<128UL> bVar12;
  
  bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x17);
  bVar7 = true;
  if (((!bVar6) &&
      (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x18), !bVar6)) &&
     (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x19), !bVar6)) {
    bVar7 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x1a);
  }
  iVar8 = (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0x16])(this);
  if ((char)iVar8 == '\0') {
    __y = StyleSheetSpecification::GetRegisteredPropertiesForcingLayout();
    bVar12 = ::std::operator&(&changed_properties->defined_ids,&__y->defined_ids);
    if (bVar12.super__Base_bitset<2UL>._M_w[1] != 0 || bVar12.super__Base_bitset<2UL>._M_w[0] != 0)
    {
      (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0x15])(this);
      goto LAB_00282de1;
    }
    if (bVar7 != false) {
      CVar5 = (this->meta->computed_values).common;
      if ((((undefined1  [96])CVar5 & (undefined1  [96])0x20) != (undefined1  [96])0x0) &&
         ((((undefined1  [96])CVar5 & (undefined1  [96])0x30000000000) != (undefined1  [96])0x0 &&
          ((undefined1  [96])CVar5 & (undefined1  [96])0x60000) == (undefined1  [96])0x0) &&
          ((undefined1  [96])CVar5 & (undefined1  [96])0x3000000000) != (undefined1  [96])0x0 ||
          (((undefined1  [96])CVar5 & (undefined1  [96])0xc00000000) != (undefined1  [96])0x0 &&
          ((undefined1  [96])CVar5 & (undefined1  [96])0x180000) == (undefined1  [96])0x0) &&
          ((undefined1  [96])CVar5 & (undefined1  [96])0xc000000000) != (undefined1  [96])0x0)) {
        (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0x15])(this);
      }
      goto LAB_00282de6;
    }
  }
  else {
LAB_00282de1:
    if (bVar7 != false) {
LAB_00282de6:
      UpdateOffset(this);
      DirtyAbsoluteOffset(this);
    }
  }
  bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x2a);
  if ((bVar6) || (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x15), bVar6))
  {
    uVar2 = *(ulong *)&(this->meta->computed_values).common;
    bVar10 = (uVar2 & 0xf) != 0;
    bVar7 = ((uint)uVar2 >> 0xe & 1) == 0;
    bVar6 = bVar7 && bVar10;
    if (this->visible != bVar6) {
      this->visible = bVar6;
      if (this->parent == (Element *)0x0) {
        if (!bVar7 || !bVar10) goto LAB_00282e53;
      }
      else {
        DirtyStackingContext(this->parent);
        if ((this->visible & 1U) == 0) {
LAB_00282e53:
          Blur(this);
        }
      }
    }
  }
  bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x11);
  bVar10 = true;
  bVar7 = true;
  if (!bVar6) {
    bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x12);
    bVar7 = true;
    if (!bVar6) {
      bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x13);
      bVar7 = true;
      if (!bVar6) {
        bVar7 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x14);
      }
    }
  }
  bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x4f);
  if ((!bVar6) &&
     (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x50), !bVar6)) {
    bVar10 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x4d);
  }
  bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x1e);
  if ((bVar10 != false) || (bVar6)) {
    pEVar3 = this->meta;
    fVar11 = 0.0;
    bVar6 = ((undefined1  [96])(pEVar3->computed_values).common & (undefined1  [96])0x40000000000)
            != (undefined1  [96])0x0;
    if (bVar6) {
      fVar11 = (pEVar3->computed_values).common.z_index_value;
    }
    bVar9 = true;
    if (((!bVar6) && (this->local_stacking_context_forced == false)) &&
       (uVar1 = *(uint *)&(pEVar3->computed_values).rare, (uVar1 & 0xc000000) == 0)) {
      bVar9 = (bool)((byte)(uVar1 >> 0x19) & 1);
    }
    if (((this->z_index != fVar11) || (NAN(this->z_index) || NAN(fVar11))) ||
       (this->local_stacking_context != bVar9)) {
      this->z_index = fVar11;
      if (this->local_stacking_context != bVar9) {
        this->local_stacking_context = bVar9;
        ppEVar4 = (this->stacking_context).
                  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->stacking_context).
            super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
            super__Vector_impl_data._M_finish != ppEVar4) {
          (this->stacking_context).
          super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
          super__Vector_impl_data._M_finish = ppEVar4;
        }
        this->stacking_context_dirty = bVar9;
      }
      if (this->parent != (Element *)0x0) {
        DirtyStackingContext(this->parent);
      }
    }
  }
  if (bVar7 == false) {
    bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x2b);
    if (((bVar6) ||
        (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x49), bVar6)) ||
       ((bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x2e), bVar6 ||
        (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x51), bVar6)))) {
      ElementBackgroundBorder::DirtyBackground(&this->meta->background_border);
    }
    bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,9);
    if ((((((!bVar6) &&
           (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,10), !bVar6)) &&
          (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0xb), !bVar6)) &&
         ((bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0xc), !bVar6 &&
          (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0xd), !bVar6)))) &&
        ((bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0xe), !bVar6 &&
         ((bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0xf), !bVar6 &&
          (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x10), !bVar6))))))
       && (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x49), !bVar6))
    goto LAB_0028307a;
  }
  else {
    ElementBackgroundBorder::DirtyBackground(&this->meta->background_border);
  }
  ElementBackgroundBorder::DirtyBorder(&this->meta->background_border);
LAB_0028307a:
  if ((bVar10 != false || bVar7 != false) ||
     (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x4c), bVar6)) {
    ElementEffects::DirtyEffects(&this->meta->effects);
  }
  if (((bVar7 != false) ||
      (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x49), bVar6)) ||
     (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x2e), bVar6)) {
    ElementEffects::DirtyEffectsData(&this->meta->effects);
  }
  bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x40);
  if (((bVar6) || (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x41), bVar6)
      ) || (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x42), bVar6)) {
    this->field_0x17 = this->field_0x17 | 0x40;
  }
  bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x43);
  if (((bVar6) || (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x44), bVar6)
      ) || ((bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x45), bVar6 ||
            (bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x46), bVar6)))) {
    this->field_0x17 = this->field_0x17 | 0x20;
  }
  bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x48);
  if (bVar6) {
    this->field_0x17 = this->field_0x17 | 8;
  }
  bVar6 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x47);
  if (bVar6) {
    this->field_0x17 = this->field_0x17 | 0x10;
  }
  return;
}

Assistant:

void Element::OnPropertyChange(const PropertyIdSet& changed_properties)
{
	RMLUI_ZoneScoped;
	const bool top_right_bottom_left_changed = (           //
		changed_properties.Contains(PropertyId::Top) ||    //
		changed_properties.Contains(PropertyId::Right) ||  //
		changed_properties.Contains(PropertyId::Bottom) || //
		changed_properties.Contains(PropertyId::Left)      //
	);

	// See if the document layout needs to be updated.
	if (!IsLayoutDirty())
	{
		// Force a relayout if any of the changed properties require it.
		const PropertyIdSet changed_properties_forcing_layout =
			(changed_properties & StyleSheetSpecification::GetRegisteredPropertiesForcingLayout());

		if (!changed_properties_forcing_layout.Empty())
		{
			DirtyLayout();
		}
		else if (top_right_bottom_left_changed)
		{
			// Normally, the position properties only affect the position of the element and not the layout. Thus, these properties are not registered
			// as affecting layout. However, when absolutely positioned elements with both left & right, or top & bottom are set to definite values,
			// they affect the size of the element and thereby also the layout. This layout-dirtying condition needs to be registered manually.
			using namespace Style;
			const ComputedValues& computed = GetComputedValues();
			const bool absolutely_positioned = (computed.position() == Position::Absolute || computed.position() == Position::Fixed);
			const bool sized_width =
				(computed.width().type == Width::Auto && computed.left().type != Left::Auto && computed.right().type != Right::Auto);
			const bool sized_height =
				(computed.height().type == Height::Auto && computed.top().type != Top::Auto && computed.bottom().type != Bottom::Auto);

			if (absolutely_positioned && (sized_width || sized_height))
				DirtyLayout();
		}
	}

	// Update the position.
	if (top_right_bottom_left_changed)
	{
		UpdateOffset();
		DirtyAbsoluteOffset();
	}

	// Update the visibility.
	if (changed_properties.Contains(PropertyId::Visibility) || changed_properties.Contains(PropertyId::Display))
	{
		bool new_visibility =
			(meta->computed_values.display() != Style::Display::None && meta->computed_values.visibility() == Style::Visibility::Visible);

		if (visible != new_visibility)
		{
			visible = new_visibility;

			if (parent != nullptr)
				parent->DirtyStackingContext();

			if (!visible)
				Blur();
		}
	}

	const bool border_radius_changed = (                                    //
		changed_properties.Contains(PropertyId::BorderTopLeftRadius) ||     //
		changed_properties.Contains(PropertyId::BorderTopRightRadius) ||    //
		changed_properties.Contains(PropertyId::BorderBottomRightRadius) || //
		changed_properties.Contains(PropertyId::BorderBottomLeftRadius)     //
	);
	const bool filter_or_mask_changed = (changed_properties.Contains(PropertyId::Filter) || changed_properties.Contains(PropertyId::BackdropFilter) ||
		changed_properties.Contains(PropertyId::MaskImage));

	// Update the z-index and stacking context.
	if (changed_properties.Contains(PropertyId::ZIndex) || filter_or_mask_changed)
	{
		const Style::ZIndex z_index_property = meta->computed_values.z_index();

		const float new_z_index = (z_index_property.type == Style::ZIndex::Auto ? 0.f : z_index_property.value);
		const bool enable_local_stacking_context = (z_index_property.type != Style::ZIndex::Auto || local_stacking_context_forced ||
			meta->computed_values.has_filter() || meta->computed_values.has_backdrop_filter() || meta->computed_values.has_mask_image());

		if (z_index != new_z_index || local_stacking_context != enable_local_stacking_context)
		{
			z_index = new_z_index;

			if (local_stacking_context != enable_local_stacking_context)
			{
				local_stacking_context = enable_local_stacking_context;

				// If we are no longer acting as a local stacking context, then we clear the list and are all set. Otherwise, we need to rebuild our
				// local stacking context.
				stacking_context.clear();
				stacking_context_dirty = local_stacking_context;
			}

			// When our z-index or local stacking context changes, then we must dirty our parent stacking context so we are re-indexed.
			if (parent)
				parent->DirtyStackingContext();
		}
	}

	// Dirty the background if it's changed.
	if (border_radius_changed ||                                    //
		changed_properties.Contains(PropertyId::BackgroundColor) || //
		changed_properties.Contains(PropertyId::Opacity) ||         //
		changed_properties.Contains(PropertyId::ImageColor) ||      //
		changed_properties.Contains(PropertyId::BoxShadow))         //
	{
		meta->background_border.DirtyBackground();
	}

	// Dirty the border if it's changed.
	if (border_radius_changed ||                                      //
		changed_properties.Contains(PropertyId::BorderTopWidth) ||    //
		changed_properties.Contains(PropertyId::BorderRightWidth) ||  //
		changed_properties.Contains(PropertyId::BorderBottomWidth) || //
		changed_properties.Contains(PropertyId::BorderLeftWidth) ||   //
		changed_properties.Contains(PropertyId::BorderTopColor) ||    //
		changed_properties.Contains(PropertyId::BorderRightColor) ||  //
		changed_properties.Contains(PropertyId::BorderBottomColor) || //
		changed_properties.Contains(PropertyId::BorderLeftColor) ||   //
		changed_properties.Contains(PropertyId::Opacity))
	{
		meta->background_border.DirtyBorder();
	}

	// Dirty the effects if they've changed.
	if (border_radius_changed || filter_or_mask_changed || changed_properties.Contains(PropertyId::Decorator))
	{
		meta->effects.DirtyEffects();
	}

	// Dirty the effects data when their visual looks may have changed.
	if (border_radius_changed ||                            //
		changed_properties.Contains(PropertyId::Opacity) || //
		changed_properties.Contains(PropertyId::ImageColor))
	{
		meta->effects.DirtyEffectsData();
	}

	// Check for `perspective' and `perspective-origin' changes
	if (changed_properties.Contains(PropertyId::Perspective) ||        //
		changed_properties.Contains(PropertyId::PerspectiveOriginX) || //
		changed_properties.Contains(PropertyId::PerspectiveOriginY))
	{
		DirtyTransformState(true, false);
	}

	// Check for `transform' and `transform-origin' changes
	if (changed_properties.Contains(PropertyId::Transform) ||        //
		changed_properties.Contains(PropertyId::TransformOriginX) || //
		changed_properties.Contains(PropertyId::TransformOriginY) || //
		changed_properties.Contains(PropertyId::TransformOriginZ))
	{
		DirtyTransformState(false, true);
	}

	// Check for `animation' changes
	if (changed_properties.Contains(PropertyId::Animation))
	{
		dirty_animation = true;
	}
	// Check for `transition' changes
	if (changed_properties.Contains(PropertyId::Transition))
	{
		dirty_transition = true;
	}
}